

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GTestPluginManager.cpp
# Opt level: O3

void __thiscall
TestPluginManagerPathResolution_FallsbackOnDefault_Config_Test::TestBody
          (TestPluginManagerPathResolution_FallsbackOnDefault_Config_Test *this)

{
  int iVar1;
  long lVar2;
  char *in_R9;
  pointer *__ptr;
  string configFile;
  path resolvedPath;
  path configPath;
  path resolvedPathCombined;
  path expectedDefaultPath;
  AssertHelper AStack_188;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  internal local_158 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_150;
  string local_148;
  string local_128;
  path local_108 [4];
  path local_68;
  path local_40;
  
  unsetenv("PLUGIN_CONFIG_PATH");
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"pluginlist.pb.txt","");
  plugin::detail::GetApplicationPath_abi_cxx11_();
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (local_108,&local_178,auto_format);
  std::filesystem::__cxx11::operator/(local_108 + 3,&local_40,local_108);
  std::filesystem::__cxx11::path::~path(local_108);
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_148,local_178._M_dataplus._M_p,
             local_178._M_dataplus._M_p + local_178._M_string_length);
  plugin::PluginManager::ResolveConfigPath(local_108 + 2,&local_148);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  plugin::detail::GetApplicationPath_abi_cxx11_();
  std::filesystem::__cxx11::operator/(&local_68,local_108,local_108 + 2);
  std::filesystem::__cxx11::path::~path(local_108);
  std::filesystem::__cxx11::path::path(local_108,local_108 + 2);
  std::filesystem::__cxx11::path::path(local_108 + 1,&local_68);
  iVar1 = std::filesystem::__cxx11::path::compare(local_108);
  if (iVar1 != 0) {
    iVar1 = std::filesystem::__cxx11::path::compare(local_108 + 1);
    if (iVar1 != 0) {
      local_158[0] = (internal)0x0;
      local_150 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      testing::Message::Message((Message *)&local_180);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_128,local_158,(AssertionResult *)"IsIn(configPath, expectedPaths)","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&AStack_188,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bidachon[P]PluginManager/Test/GTestPluginManager.cpp"
                 ,0xef,local_128._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&AStack_188,(Message *)&local_180);
      testing::internal::AssertHelper::~AssertHelper(&AStack_188);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
      if (local_180._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
          (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        (**(code **)(*(long *)local_180._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl + 8))();
      }
      if (local_150 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_150,local_150);
      }
    }
  }
  lVar2 = 0x28;
  do {
    std::filesystem::__cxx11::path::~path
              ((path *)((long)&local_108[0]._M_pathname._M_dataplus._M_p + lVar2));
    lVar2 = lVar2 + -0x28;
  } while (lVar2 != -0x28);
  std::filesystem::__cxx11::path::~path(&local_68);
  std::filesystem::__cxx11::path::~path(local_108 + 2);
  std::filesystem::__cxx11::path::~path(local_108 + 3);
  std::filesystem::__cxx11::path::~path(&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TEST(TestPluginManagerPathResolution, FallsbackOnDefault_Config)
{
    unsetenv("PLUGIN_CONFIG_PATH");
    std::string const configFile{"pluginlist.pb.txt"};
    auto const expectedDefaultPath = plugin::detail::GetApplicationPath();
    auto const configPath = expectedDefaultPath / configFile;

    auto const resolvedPath = plugin::PluginManager::ResolveConfigPath(configFile);
    auto const resolvedPathCombined = plugin::detail::GetApplicationPath() / resolvedPath;

    auto const expectedPaths = {resolvedPath, resolvedPathCombined};
    EXPECT_TRUE(IsIn(configPath, expectedPaths));
}